

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_SimdLdArrGeneric<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  byte dataWidth;
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 *puVar6;
  long lVar7;
  ArrayBufferBase *pAVar8;
  undefined4 extraout_var;
  ScriptContext *scriptContext;
  long lVar9;
  SIMDValue SVar10;
  
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2029,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  lVar7 = (long)*(int *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4);
  if (lVar7 < 0) {
    scriptContext = *(ScriptContext **)(this + 0x78);
  }
  else {
    lVar7 = (ulong)playout->Offset + lVar7;
    if ((*(byte *)(*(long *)(this + 0x88) + 0x46) & 8) == 0) {
      pAVar8 = (ArrayBufferBase *)GetAsmJsBuffer(this);
    }
    else {
      pAVar8 = WebAssemblyMemory::GetBuffer(*(WebAssemblyMemory **)(this + 0x138));
    }
    iVar4 = (*(((ArrayBuffer *)&pAVar8->super_DynamicObject)->super_ArrayBufferBase).
              super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])(pAVar8);
    dataWidth = playout->DataWidth;
    uVar1 = playout->Value;
    uVar5 = (*(((ArrayBuffer *)&pAVar8->super_DynamicObject)->super_ArrayBufferBase).
              super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(pAVar8);
    if ((ulong)dataWidth + lVar7 <= (ulong)uVar5) {
      SVar10 = SIMDUtils::SIMDLdData((SIMDValue *)(CONCAT44(extraout_var,iVar4) + lVar7),dataWidth);
      lVar7 = *(long *)(this + 0x148);
      lVar9 = (ulong)uVar1 * 0x10;
      *(long *)(lVar7 + lVar9) = SVar10.field_0._0_8_;
      *(long *)(lVar7 + 8 + lVar9) = SVar10.field_0._8_8_;
      return;
    }
    scriptContext = *(ScriptContext **)(this + 0x78);
  }
  JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ebf6,L"Simd typed array access");
}

Assistant:

void InterpreterStackFrame::OP_SimdLdArrGeneric(const unaligned T* playout)
    {
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);

        if (GetRegRawInt(playout->SlotIndex) < 0) {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("Simd typed array access"));
        }

        const uint64 index = (uint64)GetRegRawInt(playout->SlotIndex) + playout->Offset;

        ArrayBufferBase* arr =
#ifdef ENABLE_WASM_SIMD
        (m_functionBody->IsWasmFunction()) ?
            m_wasmMemory->GetBuffer() :
#endif
            GetAsmJsBuffer();

        BYTE* buffer = arr->GetBuffer();
        uint8 dataWidth = playout->DataWidth;
        RegSlot dstReg = playout->Value;
        if (index + dataWidth > arr->GetByteLength())
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("Simd typed array access"));
        }
        AsmJsSIMDValue *data = (AsmJsSIMDValue*)(buffer + index);
        AsmJsSIMDValue value;

        value = SIMDUtils::SIMDLdData(data, dataWidth);
        SetRegRawSimd(dstReg, value);
    }